

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void IncludeFile(fullpath_ref_t nfilename)

{
  FILE *pFVar1;
  stdin_log_t *psVar2;
  const_iterator cVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *__src;
  
  pcVar5 = rlpbuf;
  pcVar4 = rlpbuf_end;
  cVar3._M_current = stdin_read_it._M_current;
  psVar2 = stdin_log;
  pFVar1 = FP_Input;
  FP_Input = (FILE *)0x0;
  __src = strdup(rlbuf);
  if (__src == (char *)0x0) {
    ErrorOOM();
  }
  bVar6 = colonSubline;
  if (blockComment != 0) {
    Error("Internal error \'block comment\'",(char *)0x0,FATAL);
  }
  OpenFile(nfilename,(stdin_log_t *)0x0);
  rlpbuf_end = pcVar4;
  rlpbuf = pcVar5;
  colonSubline = bVar6;
  strcpy(rlbuf,__src);
  free(__src);
  FP_Input = pFVar1;
  stdin_log = psVar2;
  stdin_read_it = cVar3;
  return;
}

Assistant:

void IncludeFile(fullpath_ref_t nfilename)
{
	auto oStdin_log = stdin_log;
	auto oStdin_read_it = stdin_read_it;
	FILE* oFP_Input = FP_Input;
	FP_Input = 0;

	char* pbuf = rlpbuf, * pbuf_end = rlpbuf_end, * buf = STRDUP(rlbuf);
	if (buf == NULL) ErrorOOM();
	bool oColonSubline = colonSubline;
	if (blockComment) Error("Internal error 'block comment'", NULL, FATAL);	// comment can't INCLUDE

	OpenFile(nfilename);

	colonSubline = oColonSubline;
	rlpbuf = pbuf, rlpbuf_end = pbuf_end;
	STRCPY(rlbuf, 8192, buf);
	free(buf);

	FP_Input = oFP_Input;
	stdin_log = oStdin_log;
	stdin_read_it = oStdin_read_it;
}